

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int do_iaf_psc(int argc,char **argv)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  img *__ptr;
  code *pcVar4;
  char *p_path;
  char **argv_1;
  char **argv_00;
  int argc_1;
  int iVar5;
  char *__format;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  size_t sStack_50;
  char *local_48;
  igsc_device_handle handle;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    iVar5 = -1;
    if (quiet == 0) {
      pcVar6 = "Error: Missing arguments\n";
      sStack_50 = 0x19;
LAB_001054ad:
      fwrite(pcVar6,sStack_50,1,_stderr);
    }
  }
  else {
    pcVar6 = *argv;
    iVar5 = argc + -1;
    argv_00 = argv + 1;
    _Var2 = arg_is_token(pcVar6,"update");
    if (_Var2) {
      if (iVar5 != 0) {
        pcVar7 = (char *)0x0;
        p_path = (char *)0x0;
        do {
          pcVar6 = *argv_00;
          _Var2 = arg_is_quiet(pcVar6);
          if (_Var2) {
            quiet = 1;
          }
          else {
            _Var2 = arg_is_device(pcVar6);
            if (_Var2) {
              if (iVar5 == 1) {
                iVar5 = -1;
                goto LAB_00105514;
              }
              pcVar7 = argv_00[1];
            }
            else {
              _Var2 = arg_is_image(pcVar6);
              if (!_Var2) goto LAB_001054bb;
              if (iVar5 == 1) goto LAB_0010548a;
              p_path = argv_00[1];
            }
            iVar5 = iVar5 + -1;
            argv_00 = argv_00 + 1;
          }
          argv_00 = argv_00 + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        if (p_path != (char *)0x0) {
          local_48 = (char *)0x0;
          handle.ctx = (igsc_lib_ctx *)0x0;
          if ((pcVar7 == (char *)0x0) &&
             (iVar5 = get_first_device(&local_48), pcVar7 = local_48,
             local_48 == (char *)0x0 || iVar5 != 0)) {
            iVar5 = 1;
LAB_00105514:
            if (quiet == 0) {
              pcVar6 = "Error: No device to update\n";
              sStack_50 = 0x1b;
              goto LAB_001054ad;
            }
          }
          else {
            pcVar6 = local_48;
            __ptr = image_read_from_file(p_path);
            if (__ptr == (img *)0x0) {
              iVar5 = 1;
              if (quiet == 0) {
                __format = "Error: Failed to read :%s\n";
LAB_001055a1:
                fprintf(_stderr,__format,p_path);
              }
            }
            else {
              iVar5 = igsc_device_init_by_device(&handle,pcVar7);
              if (iVar5 == 0) {
                pcVar4 = progress_percentage_func;
                if ((quiet & 1) != 0) {
                  pcVar4 = (code *)0x0;
                }
                iVar3 = igsc_iaf_psc_update(&handle,__ptr + 1,__ptr->size,pcVar4,0);
                if (quiet == 0) {
                  putchar(10);
                }
                iVar5 = 0;
                if (iVar3 != 0) {
                  if (quiet == 0) {
                    fwrite("Error: Update process failed\n",0x1d,1,_stderr);
                  }
                  print_device_fw_status(&handle);
                  iVar5 = iVar3;
                }
              }
              else if ((quiet & 1) == 0) {
                __format = "Error: Cannot initialize device: %s\n";
                p_path = pcVar7;
                goto LAB_001055a1;
              }
            }
            igsc_device_close(&handle);
            free(__ptr);
            free(pcVar6);
          }
          goto LAB_00105617;
        }
      }
LAB_0010548a:
      iVar5 = -1;
      if (quiet == 0) {
        pcVar6 = "Error: No image to update\n";
        sStack_50 = 0x1a;
        goto LAB_001054ad;
      }
    }
    else {
      _Var2 = arg_is_token(pcVar6,"version");
      if (_Var2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          iVar5 = do_no_special_args_func(iVar5,argv_00,iaf_psc_version);
          return iVar5;
        }
        goto LAB_00105656;
      }
LAB_001054bb:
      iVar5 = -1;
      if (quiet == 0) {
        fprintf(_stderr,"Error: Wrong argument %s\n",pcVar6);
      }
    }
  }
LAB_00105617:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar5;
  }
LAB_00105656:
  __stack_chk_fail();
}

Assistant:

static int do_iaf_psc(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "update"))
    {
        return do_iaf_psc_update(argc, argv);
    }

    if (arg_is_token(sub_command, "version"))
    {
        return do_iaf_psc_version(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}